

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O3

ElabSystemTaskKind slang::ast::SemanticFacts::getElabSystemTaskKind(Token token)

{
  ElabSystemTaskKind EVar1;
  string_view sVar2;
  Token local_10;
  
  sVar2 = parsing::Token::valueText(&local_10);
  EVar1 = (*(code *)(&DAT_0047f984 + *(int *)(&DAT_0047f984 + (sVar2._M_len - 5) * 4)))();
  return EVar1;
}

Assistant:

ElabSystemTaskKind SemanticFacts::getElabSystemTaskKind(Token token) {
    auto name = token.valueText();
    if (name == "$fatal"sv)
        return ElabSystemTaskKind::Fatal;
    if (name == "$error"sv)
        return ElabSystemTaskKind::Error;
    if (name == "$warning"sv)
        return ElabSystemTaskKind::Warning;
    if (name == "$info"sv)
        return ElabSystemTaskKind::Info;
    if (name == "$static_assert"sv)
        return ElabSystemTaskKind::StaticAssert;
    SLANG_UNREACHABLE;
}